

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.cpp
# Opt level: O1

void __thiscall
gmlc::networking::SocketFactory::load_json_config_file(SocketFactory *this,string *file)

{
  stringstream strbuf;
  ifstream ifs;
  string local_3b8;
  stringstream local_398 [16];
  undefined1 local_388 [112];
  ios_base local_318 [264];
  undefined1 local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210,(string *)file,_S_in);
  std::__cxx11::stringstream::stringstream(local_398);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  parse_json_config(this,&local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_398);
  std::ios_base::~ios_base(local_318);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void SocketFactory::load_json_config_file(std::string file)
{
    std::ifstream ifs(file);
    std::stringstream strbuf;
    strbuf << ifs.rdbuf();
    parse_json_config(strbuf.str());
}